

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t
decoder_decode(aom_codec_alg_priv_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  AVxWorker *pAVar1;
  long *plVar2;
  long lVar3;
  AV1Decoder *pbi;
  size_t data_sz_00;
  int iVar4;
  aom_codec_err_t aVar5;
  uint8_t *puVar6;
  AVxWorkerInterface *pAVar7;
  char *pcVar8;
  uint64_t temporal_unit_size;
  size_t length_of_size;
  aom_codec_stream_info_t *local_50;
  EXTERNAL_REFERENCES *local_48;
  void *local_40;
  AVxWorkerInterface *local_38;
  
  release_pending_output_frames(ctx);
  if (data == (uint8_t *)0x0 && data_sz == 0) {
    ctx->flushed = 1;
  }
  else {
    if (data == (uint8_t *)0x0 || data_sz == 0) {
      return AOM_CODEC_INVALID_PARAM;
    }
    ctx->flushed = 0;
    if ((ctx->frame_worker == (AVxWorker *)0x0) &&
       (aVar5 = init_decoder(ctx), aVar5 != AOM_CODEC_OK)) {
      return aVar5;
    }
    if (ctx->is_annexb == 0) {
      puVar6 = data + data_sz;
    }
    else {
      iVar4 = aom_uleb_decode(data,data_sz,&temporal_unit_size,&length_of_size);
      if ((iVar4 != 0) ||
         (data_sz - length_of_size < CONCAT44(temporal_unit_size._4_4_,(int)temporal_unit_size))) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      data = data + length_of_size;
      puVar6 = data + CONCAT44(temporal_unit_size._4_4_,(int)temporal_unit_size);
    }
    local_50 = &ctx->si;
    local_48 = &ctx->ext_refs;
    local_40 = user_priv;
    while (data < puVar6) {
      if (ctx->is_annexb == 0) {
        length_of_size = (long)puVar6 - (long)data;
      }
      else {
        iVar4 = aom_uleb_decode(data,(long)puVar6 - (long)data,&length_of_size,&temporal_unit_size);
        if (iVar4 != 0) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        data = data + CONCAT44(temporal_unit_size._4_4_,(int)temporal_unit_size);
        if ((ulong)((long)puVar6 - (long)data) < length_of_size) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
      }
      data_sz_00 = length_of_size;
      pAVar7 = aom_get_worker_interface();
      if ((ctx->si).h == 0) {
        temporal_unit_size._0_4_ = 0;
        (ctx->si).is_annexb = ctx->is_annexb;
        aVar5 = decoder_peek_si_internal(data,data_sz_00,local_50,(int *)&temporal_unit_size);
        if (aVar5 != AOM_CODEC_OK) {
          return aVar5;
        }
        if ((int)temporal_unit_size == 0 && (ctx->si).is_kf == 0) {
          return AOM_CODEC_ERROR;
        }
      }
      pAVar1 = ctx->frame_worker;
      plVar2 = (long *)pAVar1->data1;
      plVar2[1] = (long)data;
      plVar2[3] = data_sz_00;
      plVar2[4] = (long)local_40;
      *(undefined4 *)(plVar2 + 5) = 1;
      lVar3 = *plVar2;
      *(uint *)(lVar3 + 0x9e44) = ctx->tile_mode;
      *(undefined8 *)(lVar3 + 0x58da0) = *(undefined8 *)&ctx->decode_tile_row;
      *(undefined8 *)(lVar3 + 0x58df0) = *(undefined8 *)&ctx->ext_tile_debug;
      local_38 = pAVar7;
      memcpy((void *)(lVar3 + 0x58df8),local_48,0x6808);
      *(uint *)(*plVar2 + 0x5f72c) = ctx->is_annexb;
      pAVar1->had_error = 0;
      (*local_38->execute)(pAVar1);
      pbi = (AV1Decoder *)*plVar2;
      data = (uint8_t *)plVar2[2];
      if (pAVar1->had_error == 0) {
        check_resync(ctx,pbi);
      }
      else {
        aVar5 = (pbi->error).error_code;
        if (aVar5 != AOM_CODEC_OK) {
          pcVar8 = (char *)0x0;
          if ((pbi->error).has_detail != 0) {
            pcVar8 = (pbi->error).detail;
          }
          (ctx->base).err_detail = pcVar8;
          return aVar5;
        }
      }
      for (; (data < puVar6 && (*data == '\0')); data = data + 1) {
      }
    }
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t decoder_decode(aom_codec_alg_priv_t *ctx,
                                      const uint8_t *data, size_t data_sz,
                                      void *user_priv) {
  aom_codec_err_t res = AOM_CODEC_OK;

#if CONFIG_INSPECTION
  if (user_priv != 0) {
    return decoder_inspect(ctx, data, data_sz, user_priv);
  }
#endif

  release_pending_output_frames(ctx);

  /* Sanity checks */
  /* NULL data ptr allowed if data_sz is 0 too */
  if (data == NULL && data_sz == 0) {
    ctx->flushed = 1;
    return AOM_CODEC_OK;
  }
  if (data == NULL || data_sz == 0) return AOM_CODEC_INVALID_PARAM;

  // Reset flushed when receiving a valid frame.
  ctx->flushed = 0;

  // Initialize the decoder worker on the first frame.
  if (ctx->frame_worker == NULL) {
    res = init_decoder(ctx);
    if (res != AOM_CODEC_OK) return res;
  }

  const uint8_t *data_start = data;
  const uint8_t *data_end = data + data_sz;

  if (ctx->is_annexb) {
    // read the size of this temporal unit
    size_t length_of_size;
    uint64_t temporal_unit_size;
    if (aom_uleb_decode(data_start, data_sz, &temporal_unit_size,
                        &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (temporal_unit_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
    data_end = data_start + temporal_unit_size;
  }

  // Decode in serial mode.
  while (data_start < data_end) {
    uint64_t frame_size;
    if (ctx->is_annexb) {
      // read the size of this frame unit
      size_t length_of_size;
      if (aom_uleb_decode(data_start, (size_t)(data_end - data_start),
                          &frame_size, &length_of_size) != 0) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      data_start += length_of_size;
      if (frame_size > (size_t)(data_end - data_start))
        return AOM_CODEC_CORRUPT_FRAME;
    } else {
      frame_size = (uint64_t)(data_end - data_start);
    }

    res = decode_one(ctx, &data_start, (size_t)frame_size, user_priv);
    if (res != AOM_CODEC_OK) return res;

    // Allow extra zero bytes after the frame end
    while (data_start < data_end) {
      const uint8_t marker = data_start[0];
      if (marker) break;
      ++data_start;
    }
  }

  return res;
}